

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::blit(Image *this,rgba_vec_t *rgba_data,uint x,uint y,uint width)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined4 local_28;
  uint i;
  uint width_local;
  uint y_local;
  uint x_local;
  rgba_vec_t *rgba_data_local;
  Image *this_local;
  
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(rgba_data);
    if (sVar1 <= local_28) break;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (rgba_data,(ulong)local_28);
    set_pixel(this,*pvVar2,local_28 % width + x,local_28 / width + y);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void Image::blit(const rgba_vec_t& rgba_data, const unsigned x, const unsigned y, const unsigned width) {
  for (unsigned i = 0; i < rgba_data.size(); ++i)
    set_pixel(rgba_data[i], (i % width) + x, (i / width) + y);
}